

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall
bas::Vector<State,_4UL,_bas::RawAllocator>::~Vector(Vector<State,_4UL,_bas::RawAllocator> *this)

{
  State *ptr;
  size_t n;
  
  ptr = this->m_begin;
  n = size(this);
  destruct_n<State>(ptr,n);
  if (this->m_begin != (State *)&this->m_small_buffer) {
    aligned_free(this->m_begin);
  }
  return;
}

Assistant:

~Vector()
    {
        destruct_n(m_begin, this->size());
        if (!this->is_small()) {
            m_allocator.free(m_begin);
        }
    }